

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_fft_fftsg.c
# Opt level: O1

void mayer_dofft(t_sample *fz1,t_sample *fz2,int n,int sgn)

{
  int iVar1;
  long lVar2;
  double *pdVar3;
  double *a;
  
  iVar1 = ooura_init(n * 2);
  a = ooura_buffer;
  if (iVar1 != 0) {
    if (0 < n) {
      lVar2 = 0;
      pdVar3 = ooura_buffer;
      do {
        *pdVar3 = (double)fz1[lVar2];
        pdVar3[1] = (double)fz2[lVar2];
        pdVar3 = pdVar3 + 2;
        lVar2 = lVar2 + 1;
      } while (n != (int)lVar2);
    }
    cdft(n * 2,sgn,a,ooura_bitrev,ooura_costab);
    if (0 < n) {
      lVar2 = 0;
      do {
        fz1[lVar2] = (float)*a;
        fz2[lVar2] = (float)a[1];
        a = a + 2;
        lVar2 = lVar2 + 1;
      } while (n != (int)lVar2);
    }
  }
  return;
}

Assistant:

EXTERN void mayer_dofft(t_sample *fz1, t_sample *fz2, int n, int sgn)
{
    FFTFLT *buf, *fp3;
    int i;
    t_sample *fp1, *fp2;
    if (!ooura_init(2*n))
        return;
    buf = ooura_buffer;
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        fp3[0] = *fp1++;
        fp3[1] = *fp2++;
        fp3 += 2;
    }
    cdft(2*n, sgn, buf, ooura_bitrev, ooura_costab);
    for (i = 0, fp1 = fz1, fp2 = fz2, fp3 = buf; i < n; i++)
    {
        *fp1++ = fp3[0];
        *fp2++ = fp3[1];
        fp3 += 2;
    }
}